

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void rgb2hsv(QRgb rgb,int *h,int *s,int *v)

{
  long in_FS_OFFSET;
  int local_38;
  undefined2 local_34;
  undefined6 local_32;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_2a = 0xaaaa;
  local_38 = 0;
  local_34 = 0xffff;
  local_32 = 0;
  uStack_2c = 0;
  QColor::setRgb((uint)&local_38);
  QColor::getHsv(&local_38,h,s,v);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void rgb2hsv(QRgb rgb, int &h, int &s, int &v)
{
    QColor c;
    c.setRgb(rgb);
    c.getHsv(&h, &s, &v);
}